

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.cpp
# Opt level: O2

convertable * __thiscall
mpt::collection::relation::find(relation *this,type_t type,char *name,int nlen)

{
  char cVar1;
  relation *prVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  undefined4 extraout_var;
  item_match m;
  convertable *local_60;
  char *local_58;
  ulong local_50;
  long local_48;
  type_t local_40;
  char local_38;
  
  if (nlen < 0) {
    if (name == (char *)0x0) {
      nlen = 0;
    }
    else {
      sVar4 = strlen(name);
      nlen = (int)sVar4;
    }
  }
  local_60 = (convertable *)0x0;
  sVar4 = (size_t)nlen;
  local_48 = 0;
  cVar1 = this->_sep;
  local_58 = name;
  local_50 = sVar4;
  if (name != (char *)0x0 && cVar1 != '\0') {
    pvVar5 = memchr(name,(int)cVar1,sVar4);
    if (pvVar5 != (void *)0x0) {
      local_50 = (long)pvVar5 - (long)name;
      local_48 = ~local_50 + sVar4;
    }
  }
  local_40 = type;
  local_38 = cVar1;
  iVar3 = (**this->_curr->_vptr_collection)(this->_curr,find_item,&local_60);
  if (iVar3 < 0 || local_60 == (convertable *)0x0) {
    prVar2 = this->_parent;
    if (prVar2 == (relation *)0x0) {
      local_60 = (convertable *)0x0;
    }
    else {
      iVar3 = (**prVar2->_vptr_relation)(prVar2,type,name,(ulong)(uint)nlen);
      local_60 = (convertable *)CONCAT44(extraout_var,iVar3);
    }
  }
  return local_60;
}

Assistant:

convertable *collection::relation::find(type_t type, const char *name, int nlen) const
{
	struct item_match m;
	const char *sep;
	
	if (nlen < 0) nlen = name ? strlen(name) : 0;
	
	m.conv = 0;
	m.ident = name;
	m.curr = nlen;
	m.left = 0;
	if (_sep && name && (sep = (char *) memchr(name, _sep, nlen))) {
		size_t plen = sep - name;
		m.curr = plen;
		m.left = nlen - plen - 1;
	}
	m.type = type;
	m.sep = _sep;
	
	if (_curr.each(find_item, &m) >= 0 && m.conv) {
		return m.conv;
	}
	return _parent ? _parent->find(type, name, nlen) : 0;
}